

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::recoveredgebyflips
          (tetgenmesh *this,point startpt,point endpt,face *sedge,triface *searchtet,int fullsearch)

{
  tetrahedron ppdVar1;
  tetrahedron endpt_00;
  tetrahedron ppdVar2;
  tetrahedron ppdVar3;
  interresult iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  interresult iVar8;
  int *piVar9;
  tetrahedron *pppdVar10;
  tetrahedron *pppdVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  tetrahedron *pppdVar15;
  tetrahedron *pppdVar16;
  ulong uVar17;
  bool bVar18;
  int local_f4;
  int types [2];
  int poss [4];
  flipconstraints local_a8;
  
  local_a8.fac[0] = (point)0x0;
  local_a8.remvert = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 1;
  local_a8.seg[0] = startpt;
  local_a8.seg[1] = endpt;
LAB_0012e9fb:
  do {
    point2tetorg(this,startpt,searchtet);
    iVar4 = finddirection(this,searchtet,endpt);
    if (iVar4 == ACROSSVERT) {
      bVar18 = searchtet->tet[destpivot[searchtet->ver]] == (tetrahedron)endpt;
      if (sedge == (face *)0x0 || bVar18) {
        uVar6 = (uint)bVar18;
      }
      else {
        iVar4 = ACROSSVERT;
LAB_0012f07a:
        report_selfint_edge(this,startpt,endpt,sedge,searchtet,iVar4);
LAB_0012f028:
        uVar6 = 0;
      }
      return uVar6;
    }
    uVar6 = enextesymtbl[searchtet->ver];
    searchtet->ver = uVar6;
    if (iVar4 != ACROSSFACE) {
      if (((this->checksubsegflag != 0) && (searchtet->tet[8] != (tetrahedron)0x0)) &&
         (searchtet->tet[8][ver2edge[(int)uVar6]] != (double *)0x0)) {
        if (sedge == (face *)0x0) {
          return 0;
        }
        iVar4 = ACROSSEDGE;
        goto LAB_0012f098;
      }
      iVar5 = removeedgebyflips(this,searchtet,&local_a8);
      if (iVar5 != 2) {
LAB_0012eab8:
        if (fullsearch != 0) {
          point2tetorg(this,startpt,searchtet);
          iVar4 = finddirection(this,searchtet,endpt);
          uVar13 = (ulong)(uint)enextesymtbl[searchtet->ver];
          pppdVar11 = searchtet->tet;
          uVar17 = 0;
          local_f4 = 0;
          pppdVar15 = (tetrahedron *)0x0;
LAB_0012eb12:
          ppdVar1 = pppdVar11[(uint)uVar13 & 3];
          uVar6 = (uint)ppdVar1 & 0xf;
          searchtet->ver = uVar6;
          pppdVar16 = (tetrahedron *)((ulong)ppdVar1 & 0xfffffffffffffff0);
          searchtet->tet = pppdVar16;
          uVar6 = fsymtbl[(int)(uint)uVar13][uVar6];
          searchtet->ver = uVar6;
          if (iVar4 == ACROSSFACE) {
            uVar12 = uVar6 & 3;
            iVar14 = 1;
            iVar8 = ACROSSFACE;
            iVar5 = local_f4;
            do {
              local_f4 = iVar5;
              iVar4 = iVar8;
              if (iVar14 == 4) break;
              uVar6 = uVar12 + iVar14 & 3;
              uVar13 = (ulong)(uVar6 * 4);
              iVar7 = tri_edge_test(this,(point)pppdVar16[*(int *)((long)orgpivot + uVar13)],
                                    (point)pppdVar16[*(int *)((long)destpivot + uVar13)],
                                    (point)pppdVar16[*(int *)((long)apexpivot + uVar13)],startpt,
                                    endpt,(point)pppdVar16[*(int *)((long)oppopivot + uVar13)],1,
                                    types,poss);
              iVar14 = iVar14 + 1;
              iVar8 = DISJOINT;
              local_f4 = poss[0];
              iVar5 = 0;
              iVar4 = types[0];
            } while (iVar7 == 0);
            if (iVar4 == DISJOINT) {
              iVar4 = DISJOINT;
              goto LAB_0012ed2f;
            }
            uVar17 = (ulong)uVar6;
          }
          else {
            pppdVar16 = pppdVar15;
            if (iVar4 == ACROSSEDGE) {
              iVar5 = 0;
LAB_0012eb67:
              piVar9 = enextesymtbl;
              if (iVar5 == 0) break;
              iVar14 = local_f4;
              iVar8 = iVar4;
              if (iVar5 != 2) {
                piVar9 = eprevesymtbl;
                break;
              }
              goto LAB_0012ec12;
            }
            uVar6 = (uint)uVar17;
LAB_0012ed2f:
            terminatetetgen(this,2);
            uVar17 = (ulong)uVar6;
          }
LAB_0012ed4f:
          iVar5 = 0;
          if (0 < local_f4) {
            iVar5 = local_f4;
          }
          while( true ) {
            uVar6 = (uint)uVar17;
            bVar18 = iVar5 == 0;
            iVar5 = iVar5 + -1;
            if (bVar18) break;
            uVar17 = (ulong)(uint)enexttbl[(int)uVar6];
          }
          if (iVar4 == SHAREVERT) {
            if (pppdVar16[orgpivot[(int)uVar6]] == (tetrahedron)endpt) goto LAB_0012f028;
            terminatetetgen(this,2);
          }
          searchtet->tet = pppdVar16;
          searchtet->ver = uVar6;
          ppdVar1 = pppdVar16[orgpivot[(int)uVar6]];
          endpt_00 = pppdVar16[destpivot[(int)uVar6]];
          ppdVar2 = pppdVar16[apexpivot[(int)uVar6]];
          ppdVar3 = pppdVar16[oppopivot[(int)uVar6]];
          if (iVar4 == ACROSSVERT) {
            if (sedge == (face *)0x0) goto LAB_0012f028;
LAB_0012ee96:
            terminatetetgen(this,2);
          }
          else if (iVar4 == ACROSSEDGE) {
            if (((this->checksubsegflag != 0) && (pppdVar16[8] != (tetrahedron)0x0)) &&
               (pppdVar16[8][ver2edge[(int)uVar6]] != (double *)0x0)) {
              if (sedge == (face *)0x0) goto LAB_0012f028;
              iVar4 = ACROSSEDGE;
              goto LAB_0012f07a;
            }
            iVar5 = removeedgebyflips(this,searchtet,&local_a8);
            if (iVar5 == 2) goto LAB_0012e9fb;
          }
          else {
            if (iVar4 != ACROSSFACE) goto LAB_0012ee96;
            if (((this->checksubfaceflag != 0) && (pppdVar16[9] != (tetrahedron)0x0)) &&
               (pppdVar16[9][uVar6 & 3] != (double *)0x0)) {
              if (sedge == (face *)0x0) goto LAB_0012f028;
              iVar4 = ACROSSFACE;
              goto LAB_0012f07a;
            }
            iVar5 = removefacebyflips(this,searchtet,&local_a8);
            if (iVar5 != 0) goto LAB_0012e9fb;
          }
          pppdVar11 = searchtet->tet;
          pppdVar15 = pppdVar16;
          if (pppdVar11 != (tetrahedron *)0x0) goto code_r0x0012eeb1;
          goto LAB_0012ef09;
        }
        goto LAB_0012f028;
      }
      goto LAB_0012e9fb;
    }
    if (((this->checksubfaceflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
       (searchtet->tet[9][uVar6 & 3] != (double *)0x0)) {
      if (sedge == (face *)0x0) {
        return 0;
      }
      iVar4 = ACROSSFACE;
LAB_0012f098:
      report_selfint_edge(this,startpt,endpt,sedge,searchtet,iVar4);
      return 0;
    }
    iVar5 = removefacebyflips(this,searchtet,&local_a8);
    if (iVar5 == 0) goto LAB_0012eab8;
  } while( true );
  uVar17 = (ulong)piVar9[searchtet->ver];
  pppdVar16 = searchtet->tet;
  iVar7 = tri_edge_test(this,(point)pppdVar16[orgpivot[uVar17]],(point)pppdVar16[destpivot[uVar17]],
                        (point)pppdVar16[apexpivot[uVar17]],startpt,endpt,
                        (point)pppdVar16[oppopivot[uVar17]],1,types,poss);
  iVar5 = iVar5 + 1;
  iVar4 = DISJOINT;
  local_f4 = 0;
  iVar14 = poss[0];
  iVar8 = types[0];
  if (iVar7 != 0) {
LAB_0012ec12:
    local_f4 = iVar14;
    iVar4 = iVar8;
    if (iVar8 == DISJOINT) {
      iVar5 = searchtet->ver;
      ppdVar1 = searchtet->tet[facepivot1[iVar5]];
      uVar6 = (uint)ppdVar1 & 0xf;
      searchtet->ver = uVar6;
      searchtet->tet = (tetrahedron *)((ulong)ppdVar1 & 0xfffffffffffffff0);
      searchtet->ver = facepivot2[iVar5][uVar6];
      iVar4 = DISJOINT;
      iVar5 = 0;
      goto LAB_0012eb67;
    }
    goto LAB_0012ed4f;
  }
  goto LAB_0012eb67;
code_r0x0012eeb1:
  uVar6 = searchtet->ver;
  uVar13 = (ulong)uVar6;
  if (((pppdVar11[orgpivot[(int)uVar6]] != ppdVar1) ||
      (pppdVar11[destpivot[(int)uVar6]] != endpt_00)) ||
     ((pppdVar11[apexpivot[(int)uVar6]] != ppdVar2 || (pppdVar11[oppopivot[(int)uVar6]] != ppdVar3))
     )) {
LAB_0012ef09:
    point2tetorg(this,(point)ppdVar1,searchtet);
    iVar8 = finddirection(this,searchtet,(point)endpt_00);
    if (iVar8 == ACROSSVERT) {
      pppdVar16 = searchtet->tet;
      uVar13 = (ulong)searchtet->ver;
      pppdVar11 = pppdVar16;
      if (pppdVar16[destpivot[uVar13]] == endpt_00) {
        while( true ) {
          uVar6 = (uint)uVar13;
          if (pppdVar11[apexpivot[(int)uVar6]] == ppdVar2) break;
          pppdVar10 = (tetrahedron *)((ulong)pppdVar11[facepivot1[(int)uVar6]] & 0xfffffffffffffff0)
          ;
          uVar13 = (ulong)(uint)facepivot2[(int)uVar6]
                                [(uint)pppdVar11[facepivot1[(int)uVar6]] & 0xf];
          pppdVar11 = pppdVar10;
          if (pppdVar16 == pppdVar10) goto LAB_0012f024;
        }
        searchtet->tet = pppdVar11;
        searchtet->ver = uVar6;
        if (pppdVar11[oppopivot[(int)uVar6]] == ppdVar3) goto LAB_0012eb12;
        ppdVar1 = pppdVar11[uVar6 & 3];
        uVar12 = (uint)ppdVar1 & 0xf;
        searchtet->ver = uVar12;
        pppdVar11 = (tetrahedron *)((ulong)ppdVar1 & 0xfffffffffffffff0);
        searchtet->tet = pppdVar11;
        uVar13 = (ulong)fsymtbl[(int)uVar6][uVar12];
        searchtet->ver = fsymtbl[(int)uVar6][uVar12];
        if (pppdVar11[oppopivot[uVar13]] == ppdVar3) goto LAB_0012eb12;
      }
    }
LAB_0012f024:
    searchtet->tet = (tetrahedron *)0x0;
    goto LAB_0012f028;
  }
  goto LAB_0012eb12;
}

Assistant:

int tetgenmesh::recoveredgebyflips(point startpt, point endpt, face *sedge,
                                   triface* searchtet, int fullsearch)
{
  flipconstraints fc;
  enum interresult dir;

  fc.seg[0] = startpt;
  fc.seg[1] = endpt;
  fc.checkflipeligibility = 1;

  // The mainloop of the edge reocvery.
  while (1) { // Loop I

    // Search the edge from 'startpt'.
    point2tetorg(startpt, *searchtet);
    dir = finddirection(searchtet, endpt);
    if (dir == ACROSSVERT) {
      if (dest(*searchtet) == endpt) {
        return 1; // Edge is recovered.
      } else {
        if (sedge) {
          return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
        } else {
          return 0;
        }
      }
    }

    // The edge is missing. 

    // Try to remove the first intersecting face/edge.
    enextesymself(*searchtet); // Go to the opposite face.
    if (dir == ACROSSFACE) {
      if (checksubfaceflag) {
        if (issubface(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a subface.
          }
        }
      }
      // Try to flip a crossing face.
      if (removefacebyflips(searchtet, &fc)) {
        continue;
      }
    } else if (dir == ACROSSEDGE) {
      if (checksubsegflag) {
        if (issubseg(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a segment.
          }
        }
      }
      // Try to flip an intersecting edge.
      if (removeedgebyflips(searchtet, &fc) == 2) {
        continue;
      }
    }

    // The edge is missing.

    if (fullsearch) {
      // Try to flip one of the faces/edges which intersects the edge.
      triface neightet, spintet;
      point pa, pb, pc, pd;
      badface bakface;
      enum interresult dir1;
      int types[2], poss[4], pos = 0;
      int success = 0;
      int t1ver; 
      int i, j;

      // Loop through the sequence of intersecting faces/edges from
      //   'startpt' to 'endpt'.
      point2tetorg(startpt, *searchtet);
      dir = finddirection(searchtet, endpt);

      // Go to the face/edge intersecting the searching edge.
      enextesymself(*searchtet); // Go to the opposite face.
      // This face/edge has been tried in previous step.

      while (1) { // Loop I-I

        // Find the next intersecting face/edge.
        fsymself(*searchtet);
        if (dir == ACROSSFACE) {
          neightet = *searchtet;
          j = (neightet.ver & 3); // j is the current face number.
          for (i = j + 1; i < j + 4; i++) {
            neightet.ver = (i % 4);
            pa = org(neightet);
            pb = dest(neightet);
            pc = apex(neightet);
            pd = oppo(neightet); // The above point.
            if (tri_edge_test(pa,pb,pc,startpt,endpt, pd, 1, types, poss)) {
              dir = (enum interresult) types[0];
              pos = poss[0];
              break;
            } else {
              dir = DISJOINT;
              pos = 0;
            }
          } // i
          // There must be an intersection face/edge.
          if (dir == DISJOINT) {
            terminatetetgen(this, 2);
          }
        } else if (dir == ACROSSEDGE) {
          while (1) { // Loop I-I-I
            // Check the two opposite faces (of the edge) in 'searchtet'.  
            for (i = 0; i < 2; i++) {
              if (i == 0) {
                enextesym(*searchtet, neightet);
              } else {
                eprevesym(*searchtet, neightet);
              }
              pa = org(neightet);
              pb = dest(neightet);
              pc = apex(neightet);
              pd = oppo(neightet); // The above point.
              if (tri_edge_test(pa,pb,pc,startpt,endpt,pd,1, types, poss)) {
                dir = (enum interresult) types[0];
                pos = poss[0];
                break; // for loop
              } else {
                dir = DISJOINT;
                pos = 0;
              }
            } // i
            if (dir != DISJOINT) {
              // Find an intersection face/edge.
              break;  // Loop I-I-I
            }
            // No intersection. Rotate to the next tet at the edge.
            fnextself(*searchtet);
          } // while (1) // Loop I-I-I
        } else {
          terminatetetgen(this, 2); // Report a bug
        }

        // Adjust to the intersecting edge/vertex.
        for (i = 0; i < pos; i++) {
          enextself(neightet);
        }

        if (dir == SHAREVERT) {
          // Check if we have reached the 'endpt'.
          pd = org(neightet);
          if (pd == endpt) {
            // Failed to recover the edge.
            break; // Loop I-I
          } else {
            terminatetetgen(this, 2); // Report a bug
          }
        }

        // The next to be flipped face/edge.
        *searchtet = neightet;

        // Bakup this face (tetrahedron).
        bakface.forg = org(*searchtet);
        bakface.fdest = dest(*searchtet);
        bakface.fapex = apex(*searchtet);
        bakface.foppo = oppo(*searchtet);

        // Try to flip this intersecting face/edge.
        if (dir == ACROSSFACE) {
          if (checksubfaceflag) {
            if (issubface(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a subface.
              }
            }
          }
          if (removefacebyflips(searchtet, &fc)) {
            success = 1;
            break; // Loop I-I 
          }
        } else if (dir == ACROSSEDGE) {
          if (checksubsegflag) {
            if (issubseg(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a segment.
              }
            }
          }
          if (removeedgebyflips(searchtet, &fc) == 2) {
            success = 1;
            break; // Loop I-I
          }
        } else if (dir == ACROSSVERT) {
          if (sedge) {
            //return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
            terminatetetgen(this, 2);
          } else {
            return 0;
          }
        } else {
          terminatetetgen(this, 2); 
        }

        // The face/edge is not flipped.
        if ((searchtet->tet == NULL) ||
            (org(*searchtet) != bakface.forg) ||
            (dest(*searchtet) != bakface.fdest) ||
            (apex(*searchtet) != bakface.fapex) ||
            (oppo(*searchtet) != bakface.foppo)) {
          // 'searchtet' was flipped. We must restore it.
          point2tetorg(bakface.forg, *searchtet);
          dir1 = finddirection(searchtet, bakface.fdest);
          if (dir1 == ACROSSVERT) {
            if (dest(*searchtet) == bakface.fdest) {
              spintet = *searchtet;
              while (1) {
                if (apex(spintet) == bakface.fapex) {
                  // Found the face.
                  *searchtet = spintet;
                  break;
                }
                fnextself(spintet);
                if (spintet.tet == searchtet->tet) {
                  searchtet->tet = NULL;
                  break; // Not find.
                }
	          } // while (1)
              if (searchtet->tet != NULL) {
                if (oppo(*searchtet) != bakface.foppo) {
                  fsymself(*searchtet);
                  if (oppo(*searchtet) != bakface.foppo) {
                    // The original (intersecting) tet has been flipped.
                    searchtet->tet = NULL;
                    break; // Not find.
                  }
                }
              }
            } else {
              searchtet->tet = NULL; // Not find.
            }
          } else {
            searchtet->tet = NULL; // Not find.
          }
          if (searchtet->tet == NULL) {
            success = 0; // This face/edge has been destroyed.
            break; // Loop I-I 
          }
        }
      } // while (1) // Loop I-I

      if (success) {
        // One of intersecting faces/edges is flipped.
        continue;
      }

    } // if (fullsearch)

    // The edge is missing.
    break; // Loop I

  } // while (1) // Loop I

  return 0;
}